

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void action_poison(tgestate_t *state)

{
  long in_RDI;
  
  if (((*(char *)(in_RDI + 0x6e4) == '\a') || (*(char *)(in_RDI + 0x6e5) == '\a')) &&
     ((*(byte *)(in_RDI + 599) & 0x20) == 0)) {
    *(byte *)(in_RDI + 599) = *(byte *)(in_RDI + 599) | 0x20;
    *(undefined1 *)(in_RDI + 0x75a) = 0x43;
    draw_all_items((tgestate_t *)0x1085e4);
    increase_morale_by_10_score_by_50((tgestate_t *)0x1085ed);
  }
  return;
}

Assistant:

void action_poison(tgestate_t *state)
{
  assert(state != NULL);

  if (state->items_held[0] != item_FOOD &&
      state->items_held[1] != item_FOOD)
    return; /* Have no poison. */

  if (state->item_structs[item_FOOD].item_and_flags & itemstruct_ITEM_FLAG_POISONED)
    return; /* Food is already poisoned. */

  state->item_structs[item_FOOD].item_and_flags |= itemstruct_ITEM_FLAG_POISONED;

  state->item_attributes[item_FOOD] = attribute_BRIGHT_PURPLE_OVER_BLACK;

  draw_all_items(state);

  increase_morale_by_10_score_by_50(state);
}